

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# API.cpp
# Opt level: O0

char * AGSSockAPI::AGSFormatError(int errnum)

{
  long *plVar1;
  char *pcVar2;
  int errnum_local;
  
  plVar1 = engine;
  pcVar2 = strerror(errnum);
  pcVar2 = (char *)(**(code **)(*plVar1 + 0x248))(plVar1,pcVar2);
  return pcVar2;
}

Assistant:

const char *AGSFormatError(int errnum)
{
#ifdef _WIN32
	LPSTR msg = nullptr;
	FormatMessage(FORMAT_MESSAGE_ALLOCATE_BUFFER | FORMAT_MESSAGE_FROM_SYSTEM,
	              0, errnum, 0, (LPSTR)&msg, 0, 0);
	const char *str = AGS_STRING(msg);
	LocalFree(msg);
	return str;
#else
	return AGS_STRING(strerror(errnum));
#endif
}